

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read.c
# Opt level: O0

int archive_read_data_skip(archive *_a)

{
  int iVar1;
  long in_RDI;
  int magic_test;
  int64_t offset;
  size_t size;
  void *buff;
  int r;
  archive_read *a;
  char *in_stack_00000058;
  uint in_stack_00000060;
  uint in_stack_00000064;
  archive *in_stack_00000068;
  int64_t *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  void **in_stack_ffffffffffffffc8;
  archive *in_stack_ffffffffffffffd0;
  int local_1c;
  int local_4;
  
  iVar1 = __archive_check_magic
                    (in_stack_00000068,in_stack_00000064,in_stack_00000060,in_stack_00000058);
  if (iVar1 == -0x1e) {
    local_4 = -0x1e;
  }
  else {
    if (*(long *)(*(long *)(in_RDI + 0x948) + 0x30) == 0) {
      do {
        local_1c = archive_read_data_block
                             (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                              (size_t *)CONCAT44(iVar1,in_stack_ffffffffffffffc0),
                              in_stack_ffffffffffffffb8);
      } while (local_1c == 0);
    }
    else {
      local_1c = (**(code **)(*(long *)(in_RDI + 0x948) + 0x30))(in_RDI);
    }
    if (local_1c == 1) {
      local_1c = 0;
    }
    *(undefined4 *)(in_RDI + 4) = 2;
    local_4 = local_1c;
  }
  return local_4;
}

Assistant:

int
archive_read_data_skip(struct archive *_a)
{
	struct archive_read *a = (struct archive_read *)_a;
	int r;
	const void *buff;
	size_t size;
	int64_t offset;

	archive_check_magic(_a, ARCHIVE_READ_MAGIC, ARCHIVE_STATE_DATA,
	    "archive_read_data_skip");

	if (a->format->read_data_skip != NULL)
		r = (a->format->read_data_skip)(a);
	else {
		while ((r = archive_read_data_block(&a->archive,
			    &buff, &size, &offset))
		    == ARCHIVE_OK)
			;
	}

	if (r == ARCHIVE_EOF)
		r = ARCHIVE_OK;

	a->archive.state = ARCHIVE_STATE_HEADER;
	return (r);
}